

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O1

void __thiscall
osqp::anon_unknown_0::TwoDimensionalQpTest_UsesSeparateWarmStart_Test::TestBody
          (TwoDimensionalQpTest_UsesSeparateWarmStart_Test *this)

{
  OsqpExitCode OVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar4;
  char *in_R9;
  OsqpSolver *primal_vector;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  VectorXd primal_warm_start;
  AssertHelper local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 uStack_38;
  AssertHelper local_30;
  Matrix<double,__1,_1,_0,__1,_1> local_28;
  
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  free((void *)0x0);
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)malloc(0x10);
  if (((ulong)paVar2 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (paVar2 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = execv;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_58 = (undefined1  [8])&local_28;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48._M_allocated_capacity = 1;
  local_48._8_8_ = 1;
  paVar2->_M_allocated_capacity = 0x3ff0000000000000;
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xbfd0000000000000
  ;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)paVar2;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58,
             (Scalar *)&local_68);
  if ((local_48._8_8_ + (long)pbStack_50 != *(Index *)((long)local_58 + 8)) ||
     (local_48._M_allocated_capacity != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)malloc(8);
  if (paVar2 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = execv;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  paVar2->_M_allocated_capacity = 0xbffe000000000000;
  local_48._8_8_ = (void *)0x0;
  uStack_38 = 0;
  local_58 = (undefined1  [8])
             local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  if (local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0
      && (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  primal_vector = &(this->super_TwoDimensionalQpTest).solver_;
  OsqpSolver::SetPrimalWarmStart
            ((OsqpSolver *)&local_70,
             (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
             primal_vector);
  local_68._M_head_impl._0_1_ =
       (internal)
       ((StatusRep *)CONCAT44(local_70.data_._4_4_,(uint)local_70.data_) == (StatusRep *)0x1);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((uint)local_70.data_ & 1) == 0) {
    absl::status_internal::StatusRep::Unref
              ((StatusRep *)CONCAT44(local_70.data_._4_4_,(uint)local_70.data_));
  }
  free((void *)local_48._8_8_);
  if (local_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)&local_68,
               (AssertionResult *)"solver_.SetPrimalWarmStart(primal_warm_start).ok()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x167,(char *)local_58);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_70);
LAB_00120794:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_60;
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_58 != (undefined1  [8])&local_48) {
      operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_70.data_._4_4_,(uint)local_70.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,(uint)local_70.data_) + 8))();
    }
    __ptr_00 = local_60;
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0012088a;
  }
  else {
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    local_48._8_8_ = (void *)0x0;
    uStack_38 = 0;
    pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    local_58 = (undefined1  [8])paVar2;
    OsqpSolver::SetDualWarmStart
              ((OsqpSolver *)&local_70,
               (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
               primal_vector);
    local_68._M_head_impl._0_1_ =
         (internal)
         ((StatusRep *)CONCAT44(local_70.data_._4_4_,(uint)local_70.data_) == (StatusRep *)0x1);
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (((uint)local_70.data_ & 1) == 0) {
      absl::status_internal::StatusRep::Unref
                ((StatusRep *)CONCAT44(local_70.data_._4_4_,(uint)local_70.data_));
    }
    free((void *)local_48._8_8_);
    if (local_68._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_58,(internal *)&local_68,
                 (AssertionResult *)"solver_.SetDualWarmStart(dual_warm_start).ok()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                 ,0x168,(char *)local_58);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_70);
      goto LAB_00120794;
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    OVar1 = OsqpSolver::Solve(primal_vector);
    local_68._M_head_impl._0_4_ = OVar1;
    local_70.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)local_58,"solver_.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&local_68,(OsqpExitCode *)&local_70);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                 ,0x169,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
LAB_0012085c:
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    else {
      if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_50,pbStack_50);
      }
      local_68._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OsqpSolver::iterations(primal_vector);
      local_70.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<long_long,int>
                ((internal *)local_58,"solver_.iterations()","1",(longlong *)&local_68,
                 (int *)&local_70);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x16a,pcVar4);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
        goto LAB_0012085c;
      }
    }
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0012088a;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_50;
    __ptr_00 = pbStack_50;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_0012088a:
  free(paVar2);
  free(local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

TEST_F(TwoDimensionalQpTest, UsesSeparateWarmStart) {
  VectorXd primal_warm_start(2);
  primal_warm_start << 1.0, -0.25;
  VectorXd dual_warm_start(1);
  dual_warm_start << -15.0 / 8.0;
  ASSERT_TRUE(solver_.SetPrimalWarmStart(primal_warm_start).ok());
  ASSERT_TRUE(solver_.SetDualWarmStart(dual_warm_start).ok());
  ASSERT_EQ(solver_.Solve(), OsqpExitCode::kOptimal);
  EXPECT_EQ(solver_.iterations(), 1);
}